

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O3

int HammeringPattern::get_num_digits(size_t x)

{
  int iVar1;
  
  iVar1 = 1;
  if (((((9 < x) && (iVar1 = 2, 99 < x)) && (iVar1 = 3, 999 < x)) &&
      ((iVar1 = 4, 9999 < x && (iVar1 = 5, 99999 < x)))) &&
     ((iVar1 = 6, 999999 < x && ((iVar1 = 7, 9999999 < x && (iVar1 = 8, 99999999 < x)))))) {
    iVar1 = 10 - (uint)(x < 1000000000);
  }
  return iVar1;
}

Assistant:

int HammeringPattern::get_num_digits(size_t x) {
  return (x < 10 ? 1 :
          (x < 100 ? 2 :
           (x < 1000 ? 3 :
            (x < 10000 ? 4 :
             (x < 100000 ? 5 :
              (x < 1000000 ? 6 :
               (x < 10000000 ? 7 :
              (x < 100000000 ? 8 :
                 (x < 1000000000 ? 9 : 10)))))))));
}